

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::uncheckedEnqueue(Solver *this,Lit p,CRef from)

{
  byte bVar1;
  lbool *plVar2;
  int iVar3;
  char *__function;
  VarData VVar4;
  Lit local_14;
  
  iVar3 = p.x >> 1;
  if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <=
      iVar3) {
    __assert_fail("has(k)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                  ,0x27,
                  "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                 );
  }
  plVar2 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data
  ;
  bVar1 = plVar2[iVar3].value;
  if (((byte)p.x & 1 ^ bVar1) == l_Undef && (l_Undef & 2) == 0 || (bVar1 & l_Undef & 2) != 0) {
    if (iVar3 < (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map
                .sz) {
      plVar2[iVar3].value = (byte)p.x & 1;
      if (iVar3 < (this->vardata).
                  super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz)
      {
        VVar4.level = (this->trail_lim).sz;
        VVar4.reason = from;
        (this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.
        map.data[iVar3] = VVar4;
        vec<Minisat::Lit,_int>::push_(&this->trail,&local_14);
        return;
      }
      __function = 
      "V &Minisat::IntMap<int, Minisat::Solver::VarData>::operator[](K) [K = int, V = Minisat::Solver::VarData, MkIndex = Minisat::MkIndexDefault<int>]"
      ;
    }
    else {
      __function = 
      "V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
      ;
    }
    __assert_fail("has(k)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                  ,0x28,__function);
  }
  __assert_fail("value(p) == l_Undef",
                "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/core/Solver.cc"
                ,0x1e8,"void Minisat::Solver::uncheckedEnqueue(Lit, CRef)");
}

Assistant:

void Solver::uncheckedEnqueue(Lit p, CRef from)
{
    assert(value(p) == l_Undef);
    assigns[var(p)] = lbool(!sign(p));
    vardata[var(p)] = mkVarData(from, decisionLevel());
    trail.push_(p);
}